

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

void __thiscall despot::Chain::ComputeOptimalValue(Chain *this,ChainState *state)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ACT_TYPE a;
  long lVar6;
  double v;
  double dVar7;
  double dVar8;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  allocator_type local_71;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_70;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_58;
  undefined8 local_40;
  long local_38;
  
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&local_58,5,(allocator_type *)&local_70);
  lVar3 = 8;
  do {
    *(undefined8 *)
     (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x58);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&local_70,5,&local_71);
  local_40 = Globals::NEG_INFTY;
  lVar3 = 0;
  do {
    do {
      lVar5 = lVar3 * 0x10;
      *(undefined4 *)
       (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar5) = 0xffffffff;
      *(undefined8 *)
       (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar5 + 8) = local_40;
      lVar6 = 0;
      local_38 = lVar3;
      while( true ) {
        iVar2 = (**(code **)(*(long *)this + 0x28))(this);
        if (iVar2 <= lVar6) break;
        dVar7 = 0.0;
        lVar4 = 0;
        do {
          dVar8 = 2.0;
          if ((lVar4 != 0) && (dVar8 = 10.0, lVar4 != 0x20 || lVar3 != 4)) {
            dVar8 = 0.0;
          }
          dVar7 = dVar7 + (*(double *)
                            (local_58.
                             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar4 * 2 + 8) *
                           ___cxa_finalize + dVar8) *
                          *(double *)
                           (*(long *)(*(long *)&(state->mdp_transitions_).
                                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data + lVar6 * 0x18) +
                           lVar4);
          lVar4 = lVar4 + 8;
        } while (lVar4 != 0x28);
        if (*(double *)
             (local_70.
              super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar5 + 8) <= dVar7 &&
            dVar7 != *(double *)
                      (local_70.
                       super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5 + 8)) {
          *(double *)
           (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar5 + 8) = dVar7;
          *(int *)(local_70.
                   super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar5) = (int)lVar6;
        }
        lVar6 = lVar6 + 1;
      }
      lVar3 = local_38 + 1;
    } while (lVar3 != 5);
    dVar7 = 0.0;
    lVar3 = 8;
    do {
      dVar7 = dVar7 + ABS(*(double *)
                           (local_70.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3) -
                          *(double *)
                           (local_58.
                            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3));
      uVar1 = *(undefined8 *)
               (local_70.
                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar3 + -8 + 8);
      *(undefined8 *)
       (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar3 + -8) =
           *(undefined8 *)
            (local_70.
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
             .super__Vector_impl_data._M_start + lVar3 + -8);
      *(undefined8 *)
       (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar3 + -8 + 8) = uVar1;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x58);
    lVar3 = 0;
  } while (0.001 <= dVar7);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
            (&state->policy,&local_58);
  if (local_70.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Chain::ComputeOptimalValue(ChainState& state) const {
	vector<ValuedAction> policy = vector<ValuedAction>(NUM_MDP_STATES);
	for (int s = 0; s < NUM_MDP_STATES; s++) {
		policy[s].value = 0;
	}

	vector<ValuedAction> next_policy = vector<ValuedAction>(NUM_MDP_STATES);
	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a < NumActions(); a++) {
				double v = 0;
				for (int nexts = 0; nexts < NUM_MDP_STATES; nexts++) {
					v += state.GetTransition(s, a, nexts)
						* (Reward(s, a, nexts)
							+ Globals::Discount() * policy[nexts].value);
				}

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < NUM_MDP_STATES; s++) {
			diff += fabs(next_policy[s].value - policy[s].value);
			policy[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}

	state.policy = policy;
}